

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O1

ErfLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::mutable_erf(NeuralNetworkLayer *this)

{
  ErfLayerParams *this_00;
  
  if (this->_oneof_case_[0] != 0x316) {
    clear_layer(this);
    this->_oneof_case_[0] = 0x316;
    this_00 = (ErfLayerParams *)operator_new(0x18);
    ErfLayerParams::ErfLayerParams(this_00);
    (this->layer_).erf_ = this_00;
  }
  return (ErfLayerParams *)(this->layer_).convolution_;
}

Assistant:

inline ::CoreML::Specification::ErfLayerParams* NeuralNetworkLayer::mutable_erf() {
  if (!has_erf()) {
    clear_layer();
    set_has_erf();
    layer_.erf_ = new ::CoreML::Specification::ErfLayerParams;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.NeuralNetworkLayer.erf)
  return layer_.erf_;
}